

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string * format<unsigned_long>
                   (string *__return_storage_ptr__,int fmt_num,string *fmt,unsigned_long arg)

{
  string sStack_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  format<int>(&local_78,fmt_num);
  std::operator+(&local_58,'{',&local_78);
  std::operator+(&local_38,&local_58,'}');
  format<unsigned_long>(&sStack_98,arg);
  replace_positional(__return_storage_ptr__,&local_38,&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (int fmt_num, const std::string& fmt, T arg)
{
    std::string output = fmt;
    replace_positional (output, '{' + format (fmt_num) + '}', format (arg));
    return output;
}